

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  int i;
  int iVar1;
  long lVar2;
  ulong uVar3;
  char *format;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/soulsource[P]BuddhaShader/glfw-3.2.1/src/input.c"
                  ,0xae,"void glfwSetInputMode(GLFWwindow *, int, int)");
  }
  if (_glfwInitialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  uVar3 = (ulong)(uint)mode;
  if (mode == 0x33003) {
    if (*(int *)(handle + 0x6c) != value) {
      if (value == 0) {
        lVar2 = 0;
        do {
          if (handle[lVar2 + 0x74] == (GLFWwindow)0x3) {
            handle[lVar2 + 0x74] = (GLFWwindow)0x0;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
      }
      *(uint *)(handle + 0x6c) = (uint)(value != 0);
    }
  }
  else {
    if (mode != 0x33002) {
      if (mode == 0x33001) {
        if (0xfffffffc < value - 0x34004U) {
          if (*(int *)(handle + 0x70) == value) {
            return;
          }
          *(int *)(handle + 0x70) = value;
          _glfwPlatformGetCursorPos
                    ((_GLFWwindow *)handle,(double *)(handle + 0x1e0),(double *)(handle + 0x1e8));
          iVar1 = _glfwPlatformWindowFocused((_GLFWwindow *)handle);
          if (iVar1 == 0) {
            return;
          }
          _glfwPlatformSetCursorMode((_GLFWwindow *)handle,value);
          return;
        }
        format = "Invalid cursor mode %i";
        uVar3 = (ulong)(uint)value;
      }
      else {
        format = "Invalid input mode %i";
      }
      _glfwInputError(0x10003,format,uVar3);
      return;
    }
    if (*(int *)(handle + 0x68) != value) {
      if (value == 0) {
        lVar2 = 0x7c;
        do {
          if (handle[lVar2] == (GLFWwindow)0x3) {
            handle[lVar2] = (GLFWwindow)0x0;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x1d9);
      }
      *(uint *)(handle + 0x68) = (uint)(value != 0);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
        {
            if (value != GLFW_CURSOR_NORMAL &&
                value != GLFW_CURSOR_HIDDEN &&
                value != GLFW_CURSOR_DISABLED)
            {
                _glfwInputError(GLFW_INVALID_ENUM,
                                "Invalid cursor mode %i",
                                value);
                return;
            }

            if (window->cursorMode == value)
                return;

            window->cursorMode = value;

            _glfwPlatformGetCursorPos(window,
                                      &window->virtualCursorPosX,
                                      &window->virtualCursorPosY);

            if (_glfwPlatformWindowFocused(window))
                _glfwPlatformSetCursorMode(window, value);

            return;
        }

        case GLFW_STICKY_KEYS:
        {
            if (window->stickyKeys == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky keys
                for (i = 0;  i <= GLFW_KEY_LAST;  i++)
                {
                    if (window->keys[i] == _GLFW_STICK)
                        window->keys[i] = GLFW_RELEASE;
                }
            }

            window->stickyKeys = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        }

        case GLFW_STICKY_MOUSE_BUTTONS:
        {
            if (window->stickyMouseButtons == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky mouse buttons
                for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
                {
                    if (window->mouseButtons[i] == _GLFW_STICK)
                        window->mouseButtons[i] = GLFW_RELEASE;
                }
            }

            window->stickyMouseButtons = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        }
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode %i", mode);
}